

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.hpp
# Opt level: O3

void __thiscall
diy::Collection::Collection
          (Collection *this,Create *create__,Destroy *destroy__,ExternalStorage *storage__,
          Save *save__,Load *load__)

{
  std::function<void_*()>::function(&this->create_,create__);
  std::function<void_(void_*)>::function(&this->destroy_,destroy__);
  this->storage_ = storage__;
  std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function(&this->save_,save__);
  std::function<void_(void_*,_diy::BinaryBuffer_&)>::function(&this->load_,load__);
  *(undefined8 *)((long)&(this->in_memory_).m_.super___recursive_mutex_base._M_mutex + 0x10) = 0;
  (this->in_memory_).m_.super___recursive_mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->in_memory_).m_.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->in_memory_).m_.super___recursive_mutex_base._M_mutex + 8) = 0;
  (this->in_memory_).m_.super___recursive_mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->elements_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->external_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->external_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->external_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->in_memory_).x_ = 0;
  (this->in_memory_).m_.super___recursive_mutex_base._M_mutex.__data.__kind = 1;
  return;
}

Assistant:

Collection(Create               create__,
                               Destroy              destroy__,
                               ExternalStorage*     storage__,
                               Save                 save__,
                               Load                 load__):
                        create_(create__),
                        destroy_(destroy__),
                        storage_(storage__),
                        save_(save__),
                        load_(load__),
                        in_memory_(0)               {}